

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerHLSL::to_resource_register_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,HLSLBindingFlagBits flag,char space,
          uint32_t binding,uint32_t space_set)

{
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  char (*in_stack_ffffffffffffffd0) [2];
  char local_21;
  uint32_t local_20;
  uint32_t local_1c;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,space_set);
  local_21 = space;
  local_20 = space_set;
  local_1c = binding;
  if (((this->resource_binding_flags & flag) == HLSL_BINDING_AUTO_NONE_BIT) &&
     ((remap_hlsl_resource_binding(this,flag,&local_20,&local_1c),
      flag != HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT || (local_20 != 0xffffffff)))) {
    if (0x32 < (this->hlsl_options).shader_model) {
      join<char_const(&)[13],char&,unsigned_int&,char_const(&)[8],unsigned_int&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)" : register(",(char (*) [13])&local_21,
                 (char *)&local_1c,(uint *)", space",(char (*) [8])&local_20,(uint *)0x3a4196,
                 in_stack_ffffffffffffffd0);
      return __return_storage_ptr__;
    }
    join<char_const(&)[13],char&,unsigned_int&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)" : register(",(char (*) [13])&local_21,
               (char *)&local_1c,(uint *)0x3a4196,ts_3);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_resource_register(HLSLBindingFlagBits flag, char space, uint32_t binding, uint32_t space_set)
{
	if ((flag & resource_binding_flags) == 0)
	{
		remap_hlsl_resource_binding(flag, space_set, binding);

		// The push constant block did not have a binding, and there were no remap for it,
		// so, declare without register binding.
		if (flag == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT && space_set == ResourceBindingPushConstantDescriptorSet)
			return "";

		if (hlsl_options.shader_model >= 51)
			return join(" : register(", space, binding, ", space", space_set, ")");
		else
			return join(" : register(", space, binding, ")");
	}
	else
		return "";
}